

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select_min.hpp
# Opt level: O1

__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
burst::
select_min<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<void>>
          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,int *last)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  
  if (first._M_current != last) {
    piVar3 = first._M_current;
    for (piVar4 = first._M_current + 1; piVar4 != last; piVar4 = piVar4 + 1) {
      iVar1 = *piVar4;
      piVar5 = first._M_current;
      if ((iVar1 < *piVar3) ||
         ((piVar5 = piVar3, iVar1 <= *piVar3 && (piVar5 = piVar3 + 1, piVar4 + -1 != piVar3)))) {
        iVar2 = *piVar5;
        *piVar5 = iVar1;
        *piVar4 = iVar2;
      }
      piVar3 = piVar5;
    }
    first._M_current = piVar3 + 1;
  }
  return (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)first._M_current;
}

Assistant:

auto select_min (ForwardIterator first, ForwardIterator last, BinaryPredicate compare)
    {
        if (first != last)
        {
            auto min = first;

            for (auto current = std::next(first); current != last; ++current)
            {
                if (compare(*current, *min))
                {
                    std::iter_swap(first, current);
                    min = first;
                }
                else if (not compare(*min, *current))
                {
                    ++min;
                    if (min != current)
                    {
                        std::iter_swap(min, current);
                    }
                }
            }

            return ++min;
        }

        return first;
    }